

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binjgb.c
# Opt level: O2

int main(int argc,char **argv)

{
  byte bVar1;
  uint uVar2;
  char cVar3;
  Result RVar4;
  Bool BVar5;
  EmulatorEvent EVar6;
  int iVar7;
  char *pcVar8;
  ulong uVar9;
  Ticks ticks;
  size_t __n;
  long lVar10;
  int iVar11;
  uint uVar12;
  Ticks TVar13;
  long lVar14;
  char *__assertion;
  int iVar15;
  long lVar16;
  bool bVar17;
  u32 ms;
  u32 sec;
  u32 min;
  u32 hr;
  u32 day;
  char *local_158;
  f64 local_150;
  char buffer [40];
  FileData rom;
  EmulatorInit local_108;
  char local_d8 [64];
  HostInit host_init;
  
  read_ini_file();
  parse_arguments(argc,argv);
  RVar4 = file_read_aligned(s_rom_filename,0x8000,&rom);
  iVar7 = 1;
  if (RVar4 == OK) {
    local_108.rom.data = rom.data;
    local_108.rom.size = rom.size;
    local_108.audio_frequency = s_audio_frequency;
    local_108.audio_frames = s_audio_frames;
    local_108.random_seed = s_random_seed;
    local_108.builtin_palette = s_builtin_palette;
    local_108.force_dmg = s_force_dmg;
    local_108.cgb_color_curve = s_cgb_color_curve;
    e = emulator_new(&local_108);
    if (e != (Emulator *)0x0) {
      host_init.hooks.audio_buffer_ready = (_func_void_HostHookContext_ptr_int *)0x0;
      host_init.hooks.audio_buffer_full = (_func_void_HostHookContext_ptr *)0x0;
      host_init.hooks.user_data = (void *)0x0;
      host_init.hooks.audio_add_buffer = (_func_void_HostHookContext_ptr_int_int *)0x0;
      host_init.hooks.key_down = key_down;
      host_init.hooks.key_up = key_up;
      host_init.audio_frequency = s_audio_frequency;
      host_init.render_scale = s_render_scale;
      host_init.audio_volume = s_audio_volume;
      host_init.audio_frames = s_audio_frames;
      host_init.rewind._12_4_ = 0;
      host_init.rewind.frames_per_base_state = s_rewind_frames_per_base_state;
      host_init.rewind.buffer_capacity = (ulong)s_rewind_buffer_capacity_megabytes << 0x14;
      host_init.joypad_filename = s_read_joypad_filename;
      host_init._92_4_ = 0;
      host_init.use_sgb_border = s_use_sgb_border;
      host = host_new(&host_init,e);
      if (host == (Host *)0x0) {
        iVar7 = 1;
        goto LAB_00111d82;
      }
      pcVar8 = replace_extension(s_rom_filename,".sav");
      s_save_state_filename = replace_extension(s_rom_filename,".state");
      local_158 = pcVar8;
      emulator_read_ext_ram_from_file(e,pcVar8);
      s_overlay.texture = host_create_texture(host,0xa0,0x90,HOST_TEXTURE_FORMAT_RGBA);
      local_150 = host_get_monitor_refresh_ms(host);
      while (s_running == '\0') {
        BVar5 = host_poll_events(host);
        if (BVar5 == FALSE) break;
        if (s_rewinding == '\x01') {
          uVar9 = (ulong)((float)s_rewind_scale * 70224.0);
          uVar9 = (long)((float)s_rewind_scale * 70224.0 - 9.223372e+18) & (long)uVar9 >> 0x3f |
                  uVar9;
          ticks = emulator_get_ticks(e);
          TVar13 = ticks - uVar9;
          if (uVar9 <= ticks) {
            host_rewind_to_ticks(host,TVar13);
            ticks = TVar13;
          }
          TVar13 = host_get_rewind_oldest_ticks(host);
          buffer[0] = '|';
          for (lVar10 = 1; lVar10 != 0x26; lVar10 = lVar10 + 1) {
            cVar3 = ' ';
            if (lVar10 < (int)(((ticks - TVar13) * 0x25) / (s_rewind_start - TVar13))) {
              cVar3 = '=';
            }
            buffer[lVar10] = cVar3;
          }
          buffer[0x26] = '|';
          buffer[0x27] = '\0';
          emulator_ticks_to_time(ticks,&day,&hr,&min,&sec,&ms);
          snprintf(local_d8,0x40,"%u:%02u:%02u.%02u",(ulong)(day * 0x18 + hr),(ulong)min,(ulong)sec,
                   ms / 10);
          __n = strlen(local_d8);
          memcpy(buffer + (0x27 - __n >> 1),local_d8,__n);
          set_status_text("%s");
        }
        else if (s_paused == FALSE) {
          EVar6 = host_run_ms(host,local_150);
          if ((EVar6 & 0x10) != 0) {
            set_status_text("invalid opcode!");
            s_paused = TRUE;
          }
          if (s_step_frame == '\x01') {
            host_reset_audio(host);
            s_paused = TRUE;
            s_step_frame = '\0';
          }
        }
        host_begin_video(host);
        memset(s_overlay.data,0,0x16800);
        if (s_status_text.timeout != 0) {
          s_status_text.timeout = s_status_text.timeout - 1;
          iVar7 = (int)s_status_text.len;
          if (0x9e < iVar7 * 4 + 2U) {
            __assertion = 
            "l <= r && t <= b && l >= 0 && r < SCREEN_WIDTH && t >= 0 && b < SCREEN_HEIGHT";
            pcVar8 = "void fill_rect(int, int, int, int, RGBA)";
            uVar2 = 0x62;
LAB_001122df:
            __assert_fail(__assertion,
                          "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/binjgb.c"
                          ,uVar2,pcVar8);
          }
          lVar10 = 0x134a24;
          for (iVar11 = 0x88; iVar11 != 0x8f; iVar11 = iVar11 + 1) {
            lVar14 = (ulong)(iVar7 * -4 + 0x9c) * -4 + -8;
            for (lVar16 = 0; (iVar7 << 2 | 2U) != (uint)lVar16; lVar16 = lVar16 + 1) {
              *(undefined4 *)(lVar10 + lVar16 * 4) = 0xffe0e0e0;
              lVar14 = lVar14 + -4;
            }
            lVar10 = lVar10 - lVar14;
          }
          iVar7 = 2;
          for (lVar10 = 0; bVar1 = s_status_text.data[lVar10], bVar1 != 0; lVar10 = lVar10 + 1) {
            if (lVar10 == 0x27) {
              __assertion = 
              "x >= 0 && y >= 0 && x + GLYPH_WIDTH <= SCREEN_WIDTH && y + GLYPH_HEIGHT <= SCREEN_HEIGHT"
              ;
              pcVar8 = "void draw_char(int, int, RGBA, char)";
              uVar2 = 0x71;
              goto LAB_001122df;
            }
            if ('\x1f' < (char)bVar1) {
              uVar12 = (uint)(s_font[bVar1 - 0x20] >> 1);
              uVar2 = iVar7 + 0x55a0;
              if ((s_font[bVar1 - 0x20] & 1) != 0) {
                uVar2 = iVar7 + 0x5640;
              }
              lVar14 = (ulong)uVar2 * 4 + 0x11f620;
              for (iVar11 = 0; iVar11 != 5; iVar11 = iVar11 + 1) {
                lVar14 = lVar14 + 0x274;
                iVar15 = 3;
                while (bVar17 = iVar15 != 0, iVar15 = iVar15 + -1, bVar17) {
                  if ((uVar12 & 1) != 0) {
                    *(undefined4 *)(lVar14 + -0x274) = 0xff0000ff;
                  }
                  uVar12 = uVar12 >> 1;
                  lVar14 = lVar14 + 4;
                }
              }
            }
            iVar7 = iVar7 + 4;
          }
          host_upload_texture(host,s_overlay.texture,0xa0,0x90,s_overlay.data);
          host_render_screen_overlay(host,s_overlay.texture);
        }
        host_end_video(host);
      }
      if (s_write_joypad_filename == (char *)0x0) {
        emulator_write_ext_ram_to_file(e,local_158);
      }
      else {
        host_write_joypad_to_file(host,s_write_joypad_filename);
      }
      iVar7 = 0;
    }
  }
  if (host != (Host *)0x0) {
    host_delete(host);
  }
LAB_00111d82:
  if (e != (Emulator *)0x0) {
    emulator_delete(e);
  }
  return iVar7;
}

Assistant:

int main(int argc, char** argv) {
  int result = 1;

  read_ini_file();

  parse_arguments(argc, argv);

  FileData rom;
  CHECK(SUCCESS(file_read_aligned(s_rom_filename, MINIMUM_ROM_SIZE, &rom)));

  EmulatorInit emulator_init;
  ZERO_MEMORY(emulator_init);
  emulator_init.rom = rom;
  emulator_init.audio_frequency = s_audio_frequency;
  emulator_init.audio_frames = s_audio_frames;
  emulator_init.random_seed = s_random_seed;
  emulator_init.builtin_palette = s_builtin_palette;
  emulator_init.force_dmg = s_force_dmg;
  emulator_init.cgb_color_curve = s_cgb_color_curve;
  e = emulator_new(&emulator_init);
  CHECK(e != NULL);

  HostInit host_init;
  ZERO_MEMORY(host_init);
  host_init.hooks.key_down = key_down;
  host_init.hooks.key_up = key_up;
  host_init.render_scale = s_render_scale;
  host_init.audio_frequency = s_audio_frequency;
  host_init.audio_frames = s_audio_frames;
  host_init.audio_volume = s_audio_volume;
  host_init.rewind.frames_per_base_state = s_rewind_frames_per_base_state;
  host_init.rewind.buffer_capacity = s_rewind_buffer_capacity_megabytes * MEGABYTES(1);
  host_init.joypad_filename = s_read_joypad_filename;
  host_init.use_sgb_border = s_use_sgb_border;
  host = host_new(&host_init, e);
  CHECK(host != NULL);

  const char* save_filename = replace_extension(s_rom_filename, SAVE_EXTENSION);
  s_save_state_filename =
      replace_extension(s_rom_filename, SAVE_STATE_EXTENSION);
  emulator_read_ext_ram_from_file(e, save_filename);

  s_overlay.texture = host_create_texture(host, SCREEN_WIDTH, SCREEN_HEIGHT,
                                          HOST_TEXTURE_FORMAT_RGBA);

  f64 refresh_ms = host_get_monitor_refresh_ms(host);
  while (s_running && host_poll_events(host)) {
    if (s_rewinding) {
      rewind_by((Ticks)(PPU_FRAME_TICKS * s_rewind_scale));
    } else if (!s_paused) {
      EmulatorEvent event = host_run_ms(host, refresh_ms);
      if (event & EMULATOR_EVENT_INVALID_OPCODE) {
        set_status_text("invalid opcode!");
        s_paused = TRUE;
      }
      if (s_step_frame) {
        host_reset_audio(host);
        s_paused = TRUE;
        s_step_frame = FALSE;
      }
    }

    host_begin_video(host);
    update_overlay();
    host_end_video(host);
  }

  if (s_write_joypad_filename) {
    host_write_joypad_to_file(host, s_write_joypad_filename);
  } else {
    emulator_write_ext_ram_to_file(e, save_filename);
  }

  result = 0;
error:
  if (host) {
    host_delete(host);
  }
  if (e) {
    emulator_delete(e);
  }
  return result;
}